

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O2

string * __thiscall net_uv::Server::getIP_abi_cxx11_(string *__return_storage_ptr__,Server *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_ip);
  return __return_storage_ptr__;
}

Assistant:

std::string Server::getIP()
{
	return m_ip;
}